

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreInstPrinter.c
# Opt level: O0

void XCore_printInst(MCInst *MI,SStream *O,void *Info)

{
  void *Info_local;
  SStream *O_local;
  MCInst *MI_local;
  
  printInstruction(MI,O,(MCRegisterInfo *)Info);
  set_mem_access(MI,false,0);
  return;
}

Assistant:

void XCore_printInst(MCInst *MI, SStream *O, void *Info)
{
	printInstruction(MI, O, Info);
	set_mem_access(MI, false, 0);
}